

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O3

StringRef __thiscall
llvm::yaml::ScalarTraits<double,_void>::input
          (ScalarTraits<double,_void> *this,StringRef Scalar,void *param_2,double *Val)

{
  uint *puVar1;
  char cVar2;
  char *pcVar3;
  char *pcVar4;
  double dVar5;
  StringRef SVar6;
  Twine local_80;
  undefined1 local_68 [8];
  StringRef Scalar_local;
  SmallString<32U> Storage;
  char *End;
  
  Scalar_local.Data = Scalar.Data;
  local_68 = (undefined1  [8])this;
  Twine::Twine(&local_80,(StringRef *)local_68);
  puVar1 = &Storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
            super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
            super_SmallVectorBase.Size;
  Storage.super_SmallVector<char,_32U>.super_SmallVectorImpl<char>.
  super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = (void *)0x2000000000;
  Scalar_local.Length = (size_t)puVar1;
  SVar6 = Twine::toNullTerminatedStringRef(&local_80,(SmallVectorImpl<char> *)&Scalar_local.Length);
  dVar5 = strtod(SVar6.Data,
                 (char **)(Storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                           InlineElts + 0x18));
  cVar2 = *(char *)Storage.super_SmallVector<char,_32U>.super_SmallVectorStorage<char,_32U>.
                   InlineElts._24_8_;
  if (cVar2 == '\0') {
    *(double *)param_2 = dVar5;
  }
  if ((uint *)Scalar_local.Length != puVar1) {
    free((void *)Scalar_local.Length);
  }
  pcVar3 = "invalid floating point number";
  if (cVar2 == '\0') {
    pcVar3 = (char *)0x0;
  }
  pcVar4 = (char *)0x1d;
  if (cVar2 == '\0') {
    pcVar4 = (char *)0x0;
  }
  SVar6.Length = (size_t)pcVar4;
  SVar6.Data = pcVar3;
  return SVar6;
}

Assistant:

StringRef ScalarTraits<double>::input(StringRef Scalar, void *, double &Val) {
  if (to_float(Scalar, Val))
    return StringRef();
  return "invalid floating point number";
}